

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseMoveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  bool bVar1;
  QGraphicsWidget *pQVar2;
  pointer pWVar3;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  qreal qVar5;
  qreal qVar6;
  QPointF QVar7;
  QSizeF QVar8;
  QGraphicsWidget *q;
  QRectF newGeometry;
  QLineF parentYDelta;
  QLineF parentXDelta;
  QLineF parentDelta;
  QLineF delta;
  undefined8 in_stack_fffffffffffff8c8;
  MouseButton other;
  QGraphicsWidgetPrivate *in_stack_fffffffffffff8d0;
  QRectF *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  QGraphicsItem *in_stack_fffffffffffff8e8;
  QPointF *in_stack_fffffffffffff8f0;
  SizeHint which;
  QGraphicsItem *in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff918;
  MouseButton button;
  QSizeF local_628;
  QSizeF local_618;
  QSizeF local_608;
  QGraphicsWidget *widget;
  QSizeF in_stack_fffffffffffffa18;
  WindowFrameSection in_stack_fffffffffffffa2c;
  QRectF *in_stack_fffffffffffffa30;
  QRectF *in_stack_fffffffffffffa38;
  qreal local_5a8;
  qreal local_5a0;
  qreal local_598;
  qreal local_590;
  QSizeF local_588;
  QSizeF local_578;
  QSizeF local_568;
  QPointF local_558;
  QPointF local_548;
  QPointF local_538;
  qreal local_528;
  qreal local_520;
  qreal local_518;
  qreal local_510;
  QSizeF local_508;
  QSizeF local_4f8;
  QSizeF local_4e8;
  QPointF local_4d8;
  qreal local_4c8;
  qreal local_4c0;
  qreal local_4b8;
  qreal local_4b0;
  QSizeF local_4a8;
  QSizeF local_498;
  QSizeF local_488;
  QPointF local_478;
  qreal local_468;
  qreal local_460;
  qreal local_458;
  qreal local_450;
  QSizeF local_448;
  QSizeF local_438;
  QSizeF local_428;
  QPointF local_418;
  qreal local_408;
  qreal local_400;
  qreal local_3f8;
  qreal local_3f0;
  QSizeF local_3e8;
  QSizeF local_3d8;
  QSizeF local_3c8;
  QPointF local_3b8;
  QPointF local_3a8;
  QPointF local_398;
  qreal local_388;
  qreal local_380;
  qreal local_378;
  qreal local_370;
  QSizeF local_368;
  QSizeF local_358;
  QSizeF local_348;
  QPointF local_338;
  QPointF local_328;
  QPointF local_318;
  qreal local_308;
  qreal local_300;
  qreal local_2f8;
  qreal local_2f0;
  QSizeF local_2e8;
  QSizeF local_2d8;
  QSizeF local_2c8;
  QPointF local_2b8;
  QPointF local_2a8;
  QPointF local_298;
  qreal local_288;
  qreal local_280;
  qreal local_278;
  qreal local_270;
  QSizeF local_268;
  QSizeF local_258;
  QSizeF local_248;
  QPointF local_238;
  QPointF local_228;
  QPointF local_218;
  qreal local_208;
  qreal local_200;
  qreal local_1f8;
  qreal local_1f0;
  QRectF local_1e8;
  QPointF local_1c8;
  QPointF local_1b8;
  QPointF local_1a8;
  QPointF local_198;
  QPointF local_188;
  QPointF local_178;
  QLineF local_168;
  QPointF local_148;
  QPointF local_138;
  QPointF local_128;
  QPointF local_118;
  QPointF local_108;
  QPointF local_f8;
  QLineF local_e8;
  QPointF local_c8;
  QPointF local_b8;
  QPointF local_a8;
  QPointF local_98;
  QLineF local_88;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  QLineF local_38;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_10;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  button = (MouseButton)((ulong)in_stack_fffffffffffff918 >> 0x20);
  other = (MouseButton)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  ensureWindowData(in_stack_fffffffffffff8d0);
  local_10.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff8d0);
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_fffffffffffff8d0,other);
  bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
  bVar4 = true;
  if (!bVar1) {
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa57814);
    bVar4 = pWVar3->hoveredSubControl != SC_TitleBarLabel;
  }
  if (!bVar4) {
    local_38.pt2.xp = -NAN;
    local_38.pt2.yp = -NAN;
    local_38.pt1.xp = -NAN;
    local_38.pt1.yp = -NAN;
    local_58 = QGraphicsSceneMouseEvent::buttonDownScenePos
                         ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff8f0,button);
    local_48 = QGraphicsItem::mapFromScene(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    which = (SizeHint)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
    local_68 = QGraphicsSceneMouseEvent::pos((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff8d8);
    QLineF::QLineF(&local_38,&local_48,&local_68);
    local_88.pt2.xp = -NAN;
    local_88.pt2.yp = -NAN;
    local_88.pt1.xp = -NAN;
    local_88.pt1.yp = -NAN;
    local_a8 = QLineF::p1((QLineF *)in_stack_fffffffffffff8d8);
    local_98 = QGraphicsItem::mapToParent
                         (in_stack_fffffffffffff8e8,
                          (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_c8 = QLineF::p2((QLineF *)in_stack_fffffffffffff8d8);
    local_b8 = QGraphicsItem::mapToParent
                         (in_stack_fffffffffffff8e8,
                          (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    QLineF::QLineF(&local_88,&local_98,&local_b8);
    local_e8.pt2.xp = -NAN;
    local_e8.pt2.yp = -NAN;
    local_e8.pt1.xp = -NAN;
    local_e8.pt1.yp = -NAN;
    local_118 = QLineF::p1((QLineF *)in_stack_fffffffffffff8d8);
    qVar5 = QPointF::x(&local_118);
    QPointF::QPointF(&local_108,qVar5,0.0);
    local_f8 = QGraphicsItem::mapToParent
                         (in_stack_fffffffffffff8e8,
                          (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_148 = QLineF::p2((QLineF *)in_stack_fffffffffffff8d8);
    qVar5 = QPointF::x(&local_148);
    QPointF::QPointF(&local_138,qVar5,0.0);
    local_128 = QGraphicsItem::mapToParent
                          (in_stack_fffffffffffff8e8,
                           (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0))
    ;
    QLineF::QLineF(&local_e8,&local_f8,&local_128);
    local_168.pt2.xp = -NAN;
    local_168.pt2.yp = -NAN;
    local_168.pt1.xp = -NAN;
    local_168.pt1.yp = -NAN;
    local_198 = QLineF::p1((QLineF *)in_stack_fffffffffffff8d8);
    qVar5 = QPointF::y(&local_198);
    QPointF::QPointF(&local_188,0.0,qVar5);
    local_178 = QGraphicsItem::mapToParent
                          (in_stack_fffffffffffff8e8,
                           (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0))
    ;
    local_1c8 = QLineF::p2((QLineF *)in_stack_fffffffffffff8d8);
    qVar5 = QPointF::y(&local_1c8);
    QPointF::QPointF(&local_1b8,0.0,qVar5);
    local_1a8 = QGraphicsItem::mapToParent
                          (in_stack_fffffffffffff8e8,
                           (QPointF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0))
    ;
    QLineF::QLineF(&local_168,&local_178,&local_1a8);
    local_1e8.w = -NAN;
    local_1e8.h = -NAN;
    local_1e8.xp = -NAN;
    local_1e8.yp = -NAN;
    QRectF::QRectF(&local_1e8);
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa57cb3);
    switch(pWVar3->grabbedSection) {
    case NoSection:
      break;
    case LeftSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa57cf5);
      local_228 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF(&local_238,qVar5,qVar6);
      local_218 = ::operator+((QPointF *)in_stack_fffffffffffff8d8,
                              (QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa57d84);
      local_258 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_268,qVar5,qVar6);
      local_248 = ::operator-((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_208;
      local_1e8.yp = local_200;
      local_1e8.w = local_1f8;
      local_1e8.h = local_1f0;
      break;
    case TopLeftSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa57e75);
      local_2a8 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF(&local_2b8,qVar5,qVar6);
      local_298 = ::operator+((QPointF *)in_stack_fffffffffffff8d8,
                              (QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa57f04);
      local_2d8 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_2e8,qVar5,qVar6);
      local_2c8 = ::operator-((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_288;
      local_1e8.yp = local_280;
      local_1e8.w = local_278;
      local_1e8.h = local_270;
      break;
    case TopSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa57ff5);
      local_328 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF(&local_338,qVar5,qVar6);
      local_318 = ::operator+((QPointF *)in_stack_fffffffffffff8d8,
                              (QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58084);
      local_358 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_368,0.0,qVar5);
      local_348 = ::operator-((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_308;
      local_1e8.yp = local_300;
      local_1e8.w = local_2f8;
      local_1e8.h = local_2f0;
      break;
    case TopRightSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa5815f);
      local_3a8 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF(&local_3b8,qVar5,qVar6);
      local_398 = ::operator+((QPointF *)in_stack_fffffffffffff8d8,
                              (QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa581ee);
      local_3d8 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_3e8,-qVar5,qVar6);
      local_3c8 = ::operator-((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_388;
      local_1e8.yp = local_380;
      local_1e8.w = local_378;
      local_1e8.h = local_370;
      break;
    case RightSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa582f6);
      local_418 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58328);
      local_438 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_448,qVar5,0.0);
      local_428 = ::operator+((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_408;
      local_1e8.yp = local_400;
      local_1e8.w = local_3f8;
      local_1e8.h = local_3f0;
      break;
    case BottomRightSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58400);
      local_478 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58432);
      local_498 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_4a8,qVar5,qVar6);
      local_488 = ::operator+((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_468;
      local_1e8.yp = local_460;
      local_1e8.w = local_458;
      local_1e8.h = local_450;
      break;
    case BottomSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58523);
      local_4d8 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58555);
      local_4f8 = QRectF::size(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_508,0.0,qVar5);
      local_4e8 = ::operator+((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_4c8;
      local_1e8.yp = local_4c0;
      local_1e8.w = local_4b8;
      local_1e8.h = local_4b0;
      break;
    case BottomLeftSection:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58630);
      local_548 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      qVar5 = QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar6 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF(&local_558,qVar5,qVar6);
      which = (SizeHint)((ulong)qVar5 >> 0x20);
      local_538 = ::operator+((QPointF *)in_stack_fffffffffffff8d8,
                              (QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa586bf);
      local_578 = QRectF::size(in_stack_fffffffffffff8d8);
      in_stack_fffffffffffff8f8 = (QGraphicsItem *)QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar5 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QSizeF::QSizeF(&local_588,(qreal)in_stack_fffffffffffff8f8,-qVar5);
      local_568 = ::operator-((QSizeF *)in_stack_fffffffffffff8d8,
                              (QSizeF *)in_stack_fffffffffffff8d0);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_528;
      local_1e8.yp = local_520;
      local_1e8.w = local_518;
      local_1e8.h = local_510;
      break;
    case TitleBarArea:
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa587c7);
      QVar7 = QRectF::topLeft(in_stack_fffffffffffff8d8);
      in_stack_fffffffffffffa38 = (QRectF *)QVar7.xp;
      in_stack_fffffffffffff8e8 = (QGraphicsItem *)QLineF::dx((QLineF *)in_stack_fffffffffffff8d0);
      qVar5 = QLineF::dy((QLineF *)in_stack_fffffffffffff8d0);
      QPointF::QPointF((QPointF *)&stack0xfffffffffffffa28,(qreal)in_stack_fffffffffffff8e8,qVar5);
      ::operator+((QPointF *)in_stack_fffffffffffff8d8,(QPointF *)in_stack_fffffffffffff8d0);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58856);
      in_stack_fffffffffffffa18 = QRectF::size(in_stack_fffffffffffff8d8);
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (QPointF *)in_stack_fffffffffffff8d8,(QSizeF *)in_stack_fffffffffffff8d0);
      local_1e8.xp = local_5a8;
      local_1e8.yp = local_5a0;
      local_1e8.w = local_598;
      local_1e8.h = local_590;
    }
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa588e9);
    if (pWVar3->grabbedSection != NoSection) {
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58907);
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa58924);
      QSizeF::QSizeF(&local_608);
      QVar8 = QGraphicsLayoutItem::effectiveSizeHint
                        ((QGraphicsLayoutItem *)in_stack_fffffffffffff8f8,which,
                         (QSizeF *)in_stack_fffffffffffff8e8);
      widget = (QGraphicsWidget *)QVar8.ht;
      QSizeF::QSizeF(&local_628);
      local_618 = QGraphicsLayoutItem::effectiveSizeHint
                            ((QGraphicsLayoutItem *)in_stack_fffffffffffff8f8,which,
                             (QSizeF *)in_stack_fffffffffffff8e8);
      _q_boundGeometryToSizeConstraints
                (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                 (QSizeF *)in_stack_fffffffffffffa18.ht,(QSizeF *)in_stack_fffffffffffffa18.wd,
                 widget);
      (**(code **)(*(long *)&pQVar2->super_QGraphicsObject + 0x60))(pQVar2,&local_1e8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (!(event->buttons() & Qt::LeftButton) || windowData->hoveredSubControl != QStyle::SC_TitleBarLabel)
        return;

    QLineF delta(q->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)), event->pos());
    QLineF parentDelta(q->mapToParent(delta.p1()), q->mapToParent(delta.p2()));
    QLineF parentXDelta(q->mapToParent(QPointF(delta.p1().x(), 0)), q->mapToParent(QPointF(delta.p2().x(), 0)));
    QLineF parentYDelta(q->mapToParent(QPointF(0, delta.p1().y())), q->mapToParent(QPointF(0, delta.p2().y())));

    QRectF newGeometry;
    switch (windowData->grabbedSection) {
    case Qt::LeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(0, delta.dy()));
        break;
    case Qt::TopRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(-delta.dx(), delta.dy()));
        break;
    case Qt::RightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), 0));
        break;
    case Qt::BottomRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::BottomSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(0, delta.dy()));
        break;
    case Qt::BottomLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), -delta.dy()));
        break;
    case Qt::TitleBarArea:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size());
        break;
    case Qt::NoSection:
        break;
    }

    if (windowData->grabbedSection != Qt::NoSection) {
        _q_boundGeometryToSizeConstraints(windowData->startGeometry, &newGeometry,
                                          windowData->grabbedSection,
                                          q->effectiveSizeHint(Qt::MinimumSize),
                                          q->effectiveSizeHint(Qt::MaximumSize),
                                          q);
        q->setGeometry(newGeometry);
    }
}